

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_gej_double(secp256k1_gej *r,secp256k1_gej *a)

{
  undefined1 local_b8 [8];
  secp256k1_fe t4;
  secp256k1_fe t3;
  secp256k1_fe t2;
  secp256k1_fe t1;
  secp256k1_gej *a_local;
  secp256k1_gej *r_local;
  
  r->infinity = a->infinity;
  secp256k1_fe_mul(&r->z,&a->z,&a->y);
  secp256k1_fe_mul_int(&r->z,2);
  secp256k1_fe_sqr((secp256k1_fe *)(t2.n + 4),&a->x);
  secp256k1_fe_mul_int((secp256k1_fe *)(t2.n + 4),3);
  secp256k1_fe_sqr((secp256k1_fe *)(t3.n + 4),(secp256k1_fe *)(t2.n + 4));
  secp256k1_fe_sqr((secp256k1_fe *)(t4.n + 4),&a->y);
  secp256k1_fe_mul_int((secp256k1_fe *)(t4.n + 4),2);
  secp256k1_fe_sqr((secp256k1_fe *)local_b8,(secp256k1_fe *)(t4.n + 4));
  secp256k1_fe_mul_int((secp256k1_fe *)local_b8,2);
  secp256k1_fe_mul((secp256k1_fe *)(t4.n + 4),(secp256k1_fe *)(t4.n + 4),&a->x);
  memcpy(r,t4.n + 4,0x28);
  secp256k1_fe_mul_int(&r->x,4);
  secp256k1_fe_negate(&r->x,&r->x,4);
  secp256k1_fe_add(&r->x,(secp256k1_fe *)(t3.n + 4));
  secp256k1_fe_negate((secp256k1_fe *)(t3.n + 4),(secp256k1_fe *)(t3.n + 4),1);
  secp256k1_fe_mul_int((secp256k1_fe *)(t4.n + 4),6);
  secp256k1_fe_add((secp256k1_fe *)(t4.n + 4),(secp256k1_fe *)(t3.n + 4));
  secp256k1_fe_mul(&r->y,(secp256k1_fe *)(t2.n + 4),(secp256k1_fe *)(t4.n + 4));
  secp256k1_fe_negate((secp256k1_fe *)(t3.n + 4),(secp256k1_fe *)local_b8,2);
  secp256k1_fe_add(&r->y,(secp256k1_fe *)(t3.n + 4));
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_gej_double(secp256k1_gej *r, const secp256k1_gej *a) {
    /* Operations: 3 mul, 4 sqr, 0 normalize, 12 mul_int/add/negate.
     *
     * Note that there is an implementation described at
     *     https://hyperelliptic.org/EFD/g1p/auto-shortw-jacobian-0.html#doubling-dbl-2009-l
     * which trades a multiply for a square, but in practice this is actually slower,
     * mainly because it requires more normalizations.
     */
    secp256k1_fe t1,t2,t3,t4;

    r->infinity = a->infinity;

    secp256k1_fe_mul(&r->z, &a->z, &a->y);
    secp256k1_fe_mul_int(&r->z, 2);       /* Z' = 2*Y*Z (2) */
    secp256k1_fe_sqr(&t1, &a->x);
    secp256k1_fe_mul_int(&t1, 3);         /* T1 = 3*X^2 (3) */
    secp256k1_fe_sqr(&t2, &t1);           /* T2 = 9*X^4 (1) */
    secp256k1_fe_sqr(&t3, &a->y);
    secp256k1_fe_mul_int(&t3, 2);         /* T3 = 2*Y^2 (2) */
    secp256k1_fe_sqr(&t4, &t3);
    secp256k1_fe_mul_int(&t4, 2);         /* T4 = 8*Y^4 (2) */
    secp256k1_fe_mul(&t3, &t3, &a->x);    /* T3 = 2*X*Y^2 (1) */
    r->x = t3;
    secp256k1_fe_mul_int(&r->x, 4);       /* X' = 8*X*Y^2 (4) */
    secp256k1_fe_negate(&r->x, &r->x, 4); /* X' = -8*X*Y^2 (5) */
    secp256k1_fe_add(&r->x, &t2);         /* X' = 9*X^4 - 8*X*Y^2 (6) */
    secp256k1_fe_negate(&t2, &t2, 1);     /* T2 = -9*X^4 (2) */
    secp256k1_fe_mul_int(&t3, 6);         /* T3 = 12*X*Y^2 (6) */
    secp256k1_fe_add(&t3, &t2);           /* T3 = 12*X*Y^2 - 9*X^4 (8) */
    secp256k1_fe_mul(&r->y, &t1, &t3);    /* Y' = 36*X^3*Y^2 - 27*X^6 (1) */
    secp256k1_fe_negate(&t2, &t4, 2);     /* T2 = -8*Y^4 (3) */
    secp256k1_fe_add(&r->y, &t2);         /* Y' = 36*X^3*Y^2 - 27*X^6 - 8*Y^4 (4) */
}